

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

void __thiscall
boost::any::any<std::__cxx11::string&>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          type *param_2,type *param_3)

{
  pointer pcVar1;
  placeholder *ppVar2;
  
  ppVar2 = (placeholder *)operator_new(0x28);
  ppVar2->_vptr_placeholder = (_func_int **)&PTR__holder_0059edf8;
  ppVar2[1]._vptr_placeholder = (_func_int **)(ppVar2 + 3);
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(ppVar2 + 1),pcVar1,pcVar1 + value->_M_string_length);
  this->content = ppVar2;
  return;
}

Assistant:

any(ValueType&& value
            , typename boost::disable_if<boost::is_same<any&, ValueType> >::type* = 0 // disable if value has type `any&`
            , typename boost::disable_if<boost::is_const<ValueType> >::type* = 0) // disable if value has type `const ValueType&&`
          : content(new holder< typename decay<ValueType>::type >(static_cast<ValueType&&>(value)))
        {
        }